

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  size_type *psVar2;
  int iVar3;
  void *pvVar4;
  TransformNode *this_00;
  runtime_error *prVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *in_RDX;
  char *pcVar8;
  bool bVar9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  Ref<embree::SceneGraph::Node> child;
  string sStack_c8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Ref<embree::XML> *local_60;
  XMLLoader *local_58;
  string local_50;
  
  uVar10 = *(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3;
  if (uVar10 < 2) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&sStack_c8,(ParseLocation *)(*in_RDX + 0x10));
    plVar6 = (long *)std::__cxx11::string::append((char *)&sStack_c8);
    local_a8._0_8_ = *plVar6;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ == paVar7) {
      local_98._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_98._8_8_ = plVar6[3];
      local_a8._0_8_ = &local_98;
    }
    else {
      local_98._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_a8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar5,(string *)&local_a8.field_1);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sStack_c8._M_string_length = 0;
  sStack_c8.field_2._M_allocated_capacity = 0;
  sStack_c8.field_2._8_8_ = (void *)0x0;
  sVar11 = uVar10 - 1;
  if (sVar11 != 0) {
    pvVar4 = alignedMalloc(sVar11 * 0x40,0x10);
    plVar6 = *(long **)(*in_RDX + 0x80);
    sStack_c8.field_2._M_allocated_capacity = sVar11;
    sStack_c8.field_2._8_8_ = pvVar4;
    if (*(long *)(*in_RDX + 0x88) - (long)plVar6 != 8) {
      lVar12 = 0;
      uVar10 = 0;
      bVar9 = false;
      sStack_c8._M_string_length = sVar11;
      local_60 = xml;
      local_58 = this;
      do {
        pcVar8 = "AffineSpace";
        iVar3 = std::__cxx11::string::compare((char *)(*plVar6 + 0x30));
        if (iVar3 == 0) {
          load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                    ((AffineSpace3fa *)&local_a8.field_1,(XMLLoader *)pcVar8,
                     (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar12));
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8);
          *puVar1 = local_a8._0_8_;
          puVar1[1] = local_a8._8_8_;
          psVar2 = (size_type *)((long)pvVar4 + lVar12 * 8 + 0x10);
          *psVar2 = local_98._M_allocated_capacity;
          psVar2[1] = local_98._8_8_;
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8 + 0x20);
          *puVar1 = local_88;
          puVar1[1] = uStack_80;
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8 + 0x30);
          *puVar1 = local_78;
          puVar1[1] = uStack_70;
        }
        else {
          pcVar8 = "Quaternion";
          iVar3 = std::__cxx11::string::compare((char *)(**(long **)(*in_RDX + 0x80) + 0x30));
          if (iVar3 != 0) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_a8._0_8_ = *plVar6;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ == paVar7) {
              local_98._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_98._8_8_ = plVar6[3];
              local_a8._0_8_ = &local_98;
            }
            else {
              local_98._M_allocated_capacity = paVar7->_M_allocated_capacity;
            }
            local_a8._8_8_ = plVar6[1];
            *plVar6 = (long)paVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::runtime_error::runtime_error(prVar5,(string *)&local_a8.field_1);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          loadQuaternion((AffineSpace3ff *)&local_a8.field_1,(XMLLoader *)pcVar8,
                         (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar12));
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8);
          *puVar1 = local_a8._0_8_;
          puVar1[1] = local_a8._8_8_;
          psVar2 = (size_type *)((long)pvVar4 + lVar12 * 8 + 0x10);
          *psVar2 = local_98._M_allocated_capacity;
          psVar2[1] = local_98._8_8_;
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8 + 0x20);
          *puVar1 = local_88;
          puVar1[1] = uStack_80;
          puVar1 = (undefined8 *)((long)pvVar4 + lVar12 * 8 + 0x30);
          *puVar1 = local_78;
          puVar1[1] = uStack_70;
          bVar9 = true;
        }
        uVar10 = uVar10 + 1;
        plVar6 = *(long **)(*in_RDX + 0x80);
        lVar12 = lVar12 + 8;
        xml = local_60;
        this = local_58;
      } while (uVar10 < (*(long *)(*in_RDX + 0x88) - (long)plVar6 >> 3) - 1U);
      goto LAB_001861ac;
    }
  }
  bVar9 = false;
  sStack_c8._M_string_length = sStack_c8.field_2._M_allocated_capacity;
LAB_001861ac:
  loadNode((XMLLoader *)&local_a8.field_1,xml);
  this_00 = (TransformNode *)alignedMalloc(0xa0,0x10);
  SceneGraph::TransformNode::TransformNode
            (this_00,(avector<AffineSpace3ff> *)&sStack_c8,
             (Ref<embree::SceneGraph::Node> *)&local_a8.field_1);
  (this_00->spaces).quaternion = bVar9;
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 0x18))();
  }
  alignedFree((void *)sStack_c8.field_2._8_8_);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() < 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid TransformAnimation node");

    bool quaternion = false;
    avector<AffineSpace3ff> spaces(xml->size()-1);
    for (size_t i=0; i<xml->size()-1; i++)
    {
      if (xml->children[0]->name == "AffineSpace") {
        spaces[i] = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
      }
      else if (xml->children[0]->name == "Quaternion") {
        spaces[i] = loadQuaternion(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }

    Ref<SceneGraph::Node> child = loadNode(xml->children[xml->size()-1]);
    auto tnode = new SceneGraph::TransformNode(spaces,child);
    tnode->spaces.quaternion = quaternion;
    return tnode;
  }